

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction.cpp
# Opt level: O2

RawTransactionResponseStruct *
cfd::js::api::TransactionStructApi::UpdateTxInSequence
          (RawTransactionResponseStruct *__return_storage_ptr__,
          UpdateTxInSequenceRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxInSequenceRequestStruct_&)>
  local_f8;
  RawTransactionResponseStruct local_d8;
  
  RawTransactionResponseStruct::RawTransactionResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxInSequenceRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:358:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxInSequenceRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_transaction.cpp:358:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"UpdateTxInSequence",&local_119);
  ExecuteStructApi<cfd::js::api::UpdateTxInSequenceRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            (&local_d8,(api *)request,(UpdateTxInSequenceRequestStruct *)&local_118,&local_f8,in_R8)
  ;
  RawTransactionResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct TransactionStructApi::UpdateTxInSequence(
    const UpdateTxInSequenceRequestStruct& request) {
  auto call_func = [](const UpdateTxInSequenceRequestStruct& request)
      -> RawTransactionResponseStruct {  // NOLINT
    RawTransactionResponseStruct response;

    TransactionContext txc(request.tx);
    auto index = txc.GetTxInIndex(Txid(request.txid), request.vout);
    txc.SetTxInSequence(index, request.sequence);

    response.hex = txc.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result = ExecuteStructApi<
      UpdateTxInSequenceRequestStruct, RawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}